

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

bool __thiscall
basist::basisu_lowlevel_uastc_transcoder::transcode_slice
          (basisu_lowlevel_uastc_transcoder *this,void *pDst_blocks,uint32_t num_blocks_x,
          uint32_t num_blocks_y,uint8_t *pImage_data,uint32_t image_data_size,block_format fmt,
          uint32_t output_block_or_pixel_stride_in_bytes,bool bc1_allow_threecolor_blocks,
          bool has_alpha,uint32_t orig_width,uint32_t orig_height,
          uint32_t output_row_pitch_in_blocks_or_pixels,basisu_transcoder_state *pState,
          uint32_t output_rows_in_pixels,int channel0,int channel1,uint32_t decode_flags)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  void *pvVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  short sVar13;
  int iVar14;
  undefined8 *pDst;
  color32 *pPixels;
  uint8_t *puVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  color32 *pcVar19;
  ulong uVar20;
  uint32_t x;
  ulong uVar21;
  uint uVar22;
  color32 *pcVar23;
  uint32_t local_e8;
  uint32_t local_e4;
  uint32_t local_d4;
  color32 block_pixels [4] [4];
  
  if (g_transcoder_initialized == '\0') {
    __assert_fail("g_transcoder_initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2429,
                  "bool basist::basisu_lowlevel_uastc_transcoder::transcode_slice(void *, uint32_t, uint32_t, const uint8_t *, uint32_t, block_format, uint32_t, bool, bool, const uint32_t, const uint32_t, uint32_t, basisu_transcoder_state *, uint32_t, int, int, uint32_t)"
                 );
  }
  uVar17 = fmt - cRGB32;
  local_e8 = output_row_pitch_in_blocks_or_pixels;
  if (((output_row_pitch_in_blocks_or_pixels == 0) && (local_e8 = orig_width, 8 < uVar17)) &&
     (local_e8 = num_blocks_x, fmt == cFXT1_RGB)) {
    local_e8 = orig_width + 7 >> 3;
    uVar17 = 0xfffffffa;
  }
  if (output_rows_in_pixels != 0) {
    orig_height = output_rows_in_pixels;
  }
  if (8 < uVar17) {
    orig_height = output_rows_in_pixels;
  }
  if (image_data_size < num_blocks_x * num_blocks_y * 0x10) {
LAB_0015c5ba:
    bVar5 = false;
  }
  else {
    bVar5 = (bool)((byte)decode_flags >> 2 & has_alpha);
    if ((fmt & ~cETC2_RGBA) == cPVRTC1_4_RGB) {
      if (fmt == cPVRTC1_4_RGBA) {
        transcode_uastc_to_pvrtc1_4_rgba
                  ((uastc_block *)pImage_data,pDst_blocks,num_blocks_x,num_blocks_y,false);
      }
      else {
        transcode_uastc_to_pvrtc1_4_rgb
                  ((uastc_block *)pImage_data,pDst_blocks,num_blocks_x,num_blocks_y,false,bVar5);
      }
    }
    else {
      local_d4 = channel1;
      local_e4 = channel0;
      lVar3 = (ulong)local_e8 * 2;
      for (uVar9 = 0; uVar9 != num_blocks_y; uVar9 = uVar9 + 1) {
        iVar10 = (int)uVar9;
        pDst = (undefined8 *)
               ((ulong)(local_e8 * output_block_or_pixel_stride_in_bytes * iVar10) +
               (long)pDst_blocks);
        uVar17 = orig_height + iVar10 * -4;
        iVar10 = iVar10 * 4 * local_e8;
        uVar18 = (ulong)uVar17;
        if (3 < (int)uVar17) {
          uVar18 = 4;
        }
        for (uVar7 = 0; pPixels = block_pixels[0], uVar7 != num_blocks_x; uVar7 = uVar7 + 1) {
          iVar11 = (int)uVar7;
          switch(fmt) {
          case cETC1:
            if (bVar5 == false) {
              bVar6 = transcode_uastc_to_etc1((uastc_block *)pImage_data,pDst);
            }
            else {
              bVar6 = transcode_uastc_to_etc1((uastc_block *)pImage_data,pDst,3);
            }
            goto joined_r0x0015cbc9;
          case cETC2_RGBA:
            bVar6 = transcode_uastc_to_etc2_rgba((uastc_block *)pImage_data,pDst);
            break;
          case cBC1:
            bVar6 = transcode_uastc_to_bc1
                              ((uastc_block *)pImage_data,pDst,SUB41((decode_flags & 0x20) >> 5,0));
            break;
          case cBC3:
            bVar6 = transcode_uastc_to_bc3
                              ((uastc_block *)pImage_data,pDst,SUB41((decode_flags & 0x20) >> 5,0));
            break;
          case cBC4:
            if ((int)local_e4 < 1) {
              local_e4 = 0;
            }
            bVar6 = transcode_uastc_to_bc4((uastc_block *)pImage_data,pDst,false,local_e4);
            goto LAB_0015cb0b;
          case cBC5:
            if ((int)local_e4 < 1) {
              local_e4 = 0;
            }
            if ((int)local_d4 < 0) {
              local_d4 = 3;
            }
            bVar6 = transcode_uastc_to_bc5((uastc_block *)pImage_data,pDst,false,local_e4,local_d4);
            goto LAB_0015cb0b;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x2502,
                          "bool basist::basisu_lowlevel_uastc_transcoder::transcode_slice(void *, uint32_t, uint32_t, const uint8_t *, uint32_t, block_format, uint32_t, bool, bool, const uint32_t, const uint32_t, uint32_t, basisu_transcoder_state *, uint32_t, int, int, uint32_t)"
                         );
          case cBC7:
          case cBC7_M5_COLOR:
            bVar6 = transcode_uastc_to_bc7((uastc_block *)pImage_data,pDst);
            break;
          case cASTC_4x4:
            bVar6 = transcode_uastc_to_astc((uastc_block *)pImage_data,pDst);
            break;
          case cETC2_EAC_R11:
            if ((int)local_e4 < 1) {
              local_e4 = 0;
            }
            bVar6 = transcode_uastc_to_etc2_eac_r11
                              ((uastc_block *)pImage_data,pDst,SUB41((decode_flags & 0x20) >> 5,0),
                               local_e4);
            goto LAB_0015cb0b;
          case cETC2_EAC_RG11:
            if ((int)local_e4 < 1) {
              local_e4 = 0;
            }
            if ((int)local_d4 < 0) {
              local_d4 = 3;
            }
            bVar6 = transcode_uastc_to_etc2_eac_rg11
                              ((uastc_block *)pImage_data,pDst,SUB41((decode_flags & 0x20) >> 5,0),
                               local_e4,local_d4);
LAB_0015cb0b:
            if (bVar6 == false) {
              return false;
            }
            goto LAB_0015cbf3;
          case cRGBA32:
            bVar6 = unpack_uastc((uastc_block *)pImage_data,pPixels,false);
            if (output_block_or_pixel_stride_in_bytes != 4) {
              __assert_fail("sizeof(uint32_t) == output_block_or_pixel_stride_in_bytes",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                            ,0x24b1,
                            "bool basist::basisu_lowlevel_uastc_transcoder::transcode_slice(void *, uint32_t, uint32_t, const uint8_t *, uint32_t, block_format, uint32_t, bool, bool, const uint32_t, const uint32_t, uint32_t, basisu_transcoder_state *, uint32_t, int, int, uint32_t)"
                           );
            }
            pvVar8 = (void *)((long)pDst_blocks + (ulong)(uint)(iVar10 + iVar11 * 4) * 4);
            uVar17 = local_e8 + iVar11 * -4;
            uVar12 = (ulong)uVar17;
            if (3 < (int)uVar17) {
              uVar12 = 4;
            }
            for (uVar16 = 0; uVar16 < uVar18; uVar16 = uVar16 + 1) {
              uVar20 = 0;
              for (uVar21 = 0; uVar21 < uVar12; uVar21 = uVar21 + 1) {
                *(undefined4 *)((long)pvVar8 + (uVar20 & 0xffffffff)) =
                     *(undefined4 *)((long)&pPixels->field_0 + uVar20);
                uVar20 = uVar20 + 4;
              }
              pvVar8 = (void *)((long)pvVar8 + (ulong)local_e8 * 4);
              pPixels = pPixels + 4;
            }
            if (bVar6) goto LAB_0015cbf3;
            goto LAB_0015c5ba;
          case cRGB565:
          case cBGR565:
            bVar6 = unpack_uastc((uastc_block *)pImage_data,pPixels,false);
            if (output_block_or_pixel_stride_in_bytes != 2) {
              __assert_fail("sizeof(uint16_t) == output_block_or_pixel_stride_in_bytes",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                            ,0x24ce,
                            "bool basist::basisu_lowlevel_uastc_transcoder::transcode_slice(void *, uint32_t, uint32_t, const uint8_t *, uint32_t, block_format, uint32_t, bool, bool, const uint32_t, const uint32_t, uint32_t, basisu_transcoder_state *, uint32_t, int, int, uint32_t)"
                           );
            }
            pvVar8 = (void *)((long)pDst_blocks + (ulong)(uint)(iVar10 + iVar11 * 4) * 2);
            uVar17 = local_e8 + iVar11 * -4;
            uVar12 = (ulong)uVar17;
            if (3 < (int)uVar17) {
              uVar12 = 4;
            }
            for (uVar16 = 0; uVar16 < uVar18; uVar16 = uVar16 + 1) {
              uVar20 = 1;
              pcVar19 = pPixels;
              for (uVar21 = 0; uVar21 < uVar12; uVar21 = uVar21 + 1) {
                if (fmt == cRGB565) {
                  iVar11 = (uint)(pcVar19->field_0).field_0.r * 0x1f;
                  iVar14 = (uint)(pcVar19->field_0).field_0.g * 0x3f;
                  sVar13 = ((ushort)(iVar14 + (iVar14 + 0x80U >> 8) + 0x80 >> 3) & 0xffe0) +
                           ((short)iVar11 + (short)((uint)(iVar11 + 0x80) >> 8) + 0x80U & 0x7f00) *
                           8;
                  pcVar23 = (color32 *)((long)&block_pixels[uVar16][uVar21].field_0 + 2);
                }
                else {
                  iVar11 = (uint)(pcVar19->field_0).field_0.b * 0x1f;
                  iVar14 = (uint)(pcVar19->field_0).field_0.g * 0x3f;
                  sVar13 = ((ushort)(iVar14 + (iVar14 + 0x80U >> 8) + 0x80 >> 3) & 0xffe0) +
                           ((short)iVar11 + (short)((uint)(iVar11 + 0x80) >> 8) + 0x80U & 0x7f00) *
                           8;
                  pcVar23 = pcVar19;
                }
                iVar11 = (uint)(pcVar23->field_0).field_0.r * 0x1f;
                *(byte *)((long)pvVar8 + (ulong)((int)uVar20 - 1)) =
                     (byte)(iVar11 + (iVar11 + 0x80U >> 8) + 0x80 >> 8) | (byte)sVar13;
                *(char *)((long)pvVar8 + uVar20) = (char)((ushort)sVar13 >> 8);
                uVar20 = (ulong)((int)uVar20 + 2);
                pcVar19 = pcVar19 + 1;
              }
              pvVar8 = (void *)((long)pvVar8 + lVar3);
              pPixels = pPixels + 4;
            }
            goto joined_r0x0015cbc9;
          case cRGBA4444:
            bVar6 = unpack_uastc((uastc_block *)pImage_data,pPixels,false);
            if (output_block_or_pixel_stride_in_bytes != 2) {
              __assert_fail("sizeof(uint16_t) == output_block_or_pixel_stride_in_bytes",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                            ,0x24eb,
                            "bool basist::basisu_lowlevel_uastc_transcoder::transcode_slice(void *, uint32_t, uint32_t, const uint8_t *, uint32_t, block_format, uint32_t, bool, bool, const uint32_t, const uint32_t, uint32_t, basisu_transcoder_state *, uint32_t, int, int, uint32_t)"
                           );
            }
            pvVar8 = (void *)((long)pDst_blocks + (ulong)(uint)(iVar10 + iVar11 * 4) * 2);
            uVar17 = local_e8 + iVar11 * -4;
            uVar12 = (ulong)uVar17;
            if (3 < (int)uVar17) {
              uVar12 = 4;
            }
            puVar15 = &block_pixels[0][0].field_0.field_0.a;
            for (uVar16 = 0; uVar16 < uVar18; uVar16 = uVar16 + 1) {
              uVar17 = 1;
              for (uVar20 = 0; uVar20 < uVar12; uVar20 = uVar20 + 1) {
                bVar1 = puVar15[uVar20 * 4 + -3];
                bVar2 = puVar15[uVar20 * 4 + -2];
                uVar22 = (uint)puVar15[uVar20 * 4 + -1] * 0xf +
                         ((uint)puVar15[uVar20 * 4 + -1] * 0xf + 0x80 >> 8) + 0x80 >> 4;
                *(byte *)((long)pvVar8 + (ulong)(uVar17 - 1)) =
                     (byte)((uint)puVar15[uVar20 * 4] * 0xf +
                            ((uint)puVar15[uVar20 * 4] * 0xf + 0x80 >> 8) + 0x80 >> 8) |
                     (byte)uVar22 & 0xf0;
                *(byte *)((long)pvVar8 + (ulong)uVar17) =
                     (byte)(((uint)bVar2 * 0xf + 0x80 >> 8) + (uint)bVar2 * 0xf + 0x80 >> 8) |
                     (byte)(uVar22 >> 8) |
                     (byte)((((uint)bVar1 * 0xf + ((uint)bVar1 * 0xf + 0x80 >> 8) + 0x80 & 0xf00) <<
                            4) >> 8);
                uVar17 = uVar17 + 2;
              }
              pvVar8 = (void *)((long)pvVar8 + lVar3);
              puVar15 = puVar15 + 0x10;
            }
joined_r0x0015cbc9:
            if (bVar6 != false) goto LAB_0015cbf3;
            goto LAB_0015c5ba;
          case cUASTC_4x4:
            uVar4 = *(undefined8 *)((long)&((uastc_block *)pImage_data)->field_0 + 8);
            *pDst = *(undefined8 *)&((uastc_block *)pImage_data)->field_0;
            pDst[1] = uVar4;
            goto LAB_0015cbf3;
          }
          if (bVar6 == false) goto LAB_0015c5ba;
LAB_0015cbf3:
          pImage_data = (uint8_t *)((long)pImage_data + 0x10);
          pDst = (undefined8 *)((long)pDst + (ulong)output_block_or_pixel_stride_in_bytes);
        }
      }
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool basisu_lowlevel_uastc_transcoder::transcode_slice(void* pDst_blocks, uint32_t num_blocks_x, uint32_t num_blocks_y, const uint8_t* pImage_data, uint32_t image_data_size, block_format fmt,
        uint32_t output_block_or_pixel_stride_in_bytes, bool bc1_allow_threecolor_blocks, bool has_alpha, const uint32_t orig_width, const uint32_t orig_height, uint32_t output_row_pitch_in_blocks_or_pixels,
		basisu_transcoder_state* pState, uint32_t output_rows_in_pixels, int channel0, int channel1, uint32_t decode_flags)
	{
		BASISU_NOTE_UNUSED(pState);
		BASISU_NOTE_UNUSED(bc1_allow_threecolor_blocks);

		assert(g_transcoder_initialized);
		if (!g_transcoder_initialized)
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_slice: Transcoder not globally initialized.\n");
			return false;
		}

#if BASISD_SUPPORT_UASTC
		const uint32_t total_blocks = num_blocks_x * num_blocks_y;

		if (!output_row_pitch_in_blocks_or_pixels)
		{
			if (basis_block_format_is_uncompressed(fmt))
				output_row_pitch_in_blocks_or_pixels = orig_width;
			else
			{
				if (fmt == block_format::cFXT1_RGB)
					output_row_pitch_in_blocks_or_pixels = (orig_width + 7) / 8;
				else
					output_row_pitch_in_blocks_or_pixels = num_blocks_x;
			}
		}

		if (basis_block_format_is_uncompressed(fmt))
		{
			if (!output_rows_in_pixels)
				output_rows_in_pixels = orig_height;
		}

		uint32_t total_expected_block_bytes = sizeof(uastc_block) * total_blocks;
		if (image_data_size < total_expected_block_bytes)
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_slice: image_data_size < total_expected_block_bytes The file is corrupted or this is a bug.\n");
			return false;
		}

		const uastc_block* pSource_block = reinterpret_cast<const uastc_block *>(pImage_data);

		const bool high_quality = (decode_flags & cDecodeFlagsHighQuality) != 0;
		const bool from_alpha = has_alpha && (decode_flags & cDecodeFlagsTranscodeAlphaDataToOpaqueFormats) != 0;

		bool status = false;
		if ((fmt == block_format::cPVRTC1_4_RGB) || (fmt == block_format::cPVRTC1_4_RGBA))
		{
			if (fmt == block_format::cPVRTC1_4_RGBA)
				transcode_uastc_to_pvrtc1_4_rgba((const uastc_block*)pImage_data, pDst_blocks, num_blocks_x, num_blocks_y, high_quality);
			else
				transcode_uastc_to_pvrtc1_4_rgb((const uastc_block *)pImage_data, pDst_blocks, num_blocks_x, num_blocks_y, high_quality, from_alpha);
		}
		else
		{
			for (uint32_t block_y = 0; block_y < num_blocks_y; ++block_y)
			{
				void* pDst_block = (uint8_t*)pDst_blocks + block_y * output_row_pitch_in_blocks_or_pixels * output_block_or_pixel_stride_in_bytes;
								
				for (uint32_t block_x = 0; block_x < num_blocks_x; ++block_x, ++pSource_block, pDst_block = (uint8_t *)pDst_block + output_block_or_pixel_stride_in_bytes)
				{
					switch (fmt)
					{
					case block_format::cUASTC_4x4:
					{
						memcpy(pDst_block, pSource_block, sizeof(uastc_block));
						status = true;
						break;
					}
					case block_format::cETC1:
					{
						if (from_alpha)
							status = transcode_uastc_to_etc1(*pSource_block, pDst_block, 3);
						else
							status = transcode_uastc_to_etc1(*pSource_block, pDst_block);
						break;
					}
					case block_format::cETC2_RGBA:
					{
						status = transcode_uastc_to_etc2_rgba(*pSource_block, pDst_block);
						break;
					}
					case block_format::cBC1:
					{
						status = transcode_uastc_to_bc1(*pSource_block, pDst_block, high_quality);
						break;
					}
					case block_format::cBC3:
					{
						status = transcode_uastc_to_bc3(*pSource_block, pDst_block, high_quality);
						break;
					}
					case block_format::cBC4:
					{
						if (channel0 < 0) 
							channel0 = 0;
						status = transcode_uastc_to_bc4(*pSource_block, pDst_block, high_quality, channel0);
						break;
					}
					case block_format::cBC5:
					{
						if (channel0 < 0)
							channel0 = 0;
						if (channel1 < 0)
							channel1 = 3;
						status = transcode_uastc_to_bc5(*pSource_block, pDst_block, high_quality, channel0, channel1);
						break;
					}
					case block_format::cBC7:
					case block_format::cBC7_M5_COLOR: // for consistently with ETC1S
					{
						status = transcode_uastc_to_bc7(*pSource_block, pDst_block);
						break;
					}
					case block_format::cASTC_4x4:
					{
						status = transcode_uastc_to_astc(*pSource_block, pDst_block);
						break;
					}
					case block_format::cETC2_EAC_R11:
					{
						if (channel0 < 0)
							channel0 = 0;
						status = transcode_uastc_to_etc2_eac_r11(*pSource_block, pDst_block, high_quality, channel0);
						break;
					}
					case block_format::cETC2_EAC_RG11:
					{
						if (channel0 < 0)
							channel0 = 0;
						if (channel1 < 0)
							channel1 = 3;
						status = transcode_uastc_to_etc2_eac_rg11(*pSource_block, pDst_block, high_quality, channel0, channel1);
						break;
					}
					case block_format::cRGBA32:
					{
						color32 block_pixels[4][4];
						status = unpack_uastc(*pSource_block, (color32 *)block_pixels, false);

						assert(sizeof(uint32_t) == output_block_or_pixel_stride_in_bytes);
						uint8_t* pDst_pixels = static_cast<uint8_t*>(pDst_blocks) + (block_x * 4 + block_y * 4 * output_row_pitch_in_blocks_or_pixels) * sizeof(uint32_t);

						const uint32_t max_x = basisu::minimum<int>(4, (int)output_row_pitch_in_blocks_or_pixels - (int)block_x * 4);
						const uint32_t max_y = basisu::minimum<int>(4, (int)output_rows_in_pixels - (int)block_y * 4);

						for (uint32_t y = 0; y < max_y; y++)
						{
							for (uint32_t x = 0; x < max_x; x++)
							{
								const color32& c = block_pixels[y][x];

								pDst_pixels[0 + 4 * x] = c.r;
								pDst_pixels[1 + 4 * x] = c.g;
								pDst_pixels[2 + 4 * x] = c.b;
								pDst_pixels[3 + 4 * x] = c.a;
							}

							pDst_pixels += output_row_pitch_in_blocks_or_pixels * sizeof(uint32_t);
						}

						break;
					}
					case block_format::cRGB565:
					case block_format::cBGR565:
					{
						color32 block_pixels[4][4];
						status = unpack_uastc(*pSource_block, (color32*)block_pixels, false);

						assert(sizeof(uint16_t) == output_block_or_pixel_stride_in_bytes);
						uint8_t* pDst_pixels = static_cast<uint8_t*>(pDst_blocks) + (block_x * 4 + block_y * 4 * output_row_pitch_in_blocks_or_pixels) * sizeof(uint16_t);

						const uint32_t max_x = basisu::minimum<int>(4, (int)output_row_pitch_in_blocks_or_pixels - (int)block_x * 4);
						const uint32_t max_y = basisu::minimum<int>(4, (int)output_rows_in_pixels - (int)block_y * 4);

						for (uint32_t y = 0; y < max_y; y++)
						{
							for (uint32_t x = 0; x < max_x; x++)
							{
								const color32& c = block_pixels[y][x];

								const uint16_t packed = (fmt == block_format::cRGB565) ? static_cast<uint16_t>((mul_8(c.r, 31) << 11) | (mul_8(c.g, 63) << 5) | mul_8(c.b, 31)) :
									static_cast<uint16_t>((mul_8(c.b, 31) << 11) | (mul_8(c.g, 63) << 5) | mul_8(c.r, 31));

								pDst_pixels[x * 2 + 0] = (uint8_t)(packed & 0xFF);
								pDst_pixels[x * 2 + 1] = (uint8_t)((packed >> 8) & 0xFF);
							}

							pDst_pixels += output_row_pitch_in_blocks_or_pixels * sizeof(uint16_t);
						}

						break;
					}
					case block_format::cRGBA4444:
					{
						color32 block_pixels[4][4];
						status = unpack_uastc(*pSource_block, (color32*)block_pixels, false);

						assert(sizeof(uint16_t) == output_block_or_pixel_stride_in_bytes);
						uint8_t* pDst_pixels = static_cast<uint8_t*>(pDst_blocks) + (block_x * 4 + block_y * 4 * output_row_pitch_in_blocks_or_pixels) * sizeof(uint16_t);

						const uint32_t max_x = basisu::minimum<int>(4, (int)output_row_pitch_in_blocks_or_pixels - (int)block_x * 4);
						const uint32_t max_y = basisu::minimum<int>(4, (int)output_rows_in_pixels - (int)block_y * 4);

						for (uint32_t y = 0; y < max_y; y++)
						{
							for (uint32_t x = 0; x < max_x; x++)
							{
								const color32& c = block_pixels[y][x];

								const uint16_t packed = static_cast<uint16_t>((mul_8(c.r, 15) << 12) | (mul_8(c.g, 15) << 8) | (mul_8(c.b, 15) << 4) | mul_8(c.a, 15));

								pDst_pixels[x * 2 + 0] = (uint8_t)(packed & 0xFF);
								pDst_pixels[x * 2 + 1] = (uint8_t)((packed >> 8) & 0xFF);
							}

							pDst_pixels += output_row_pitch_in_blocks_or_pixels * sizeof(uint16_t);
						}
						break;
					}
					default:
						assert(0);
						break;

					}

					if (!status)
					{
						BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_slice: Transcoder failed to unpack a UASTC block - this is a bug, or the data was corrupted\n");
						return false;
					}

				} // block_x

			} // block_y
		}

		return true;
#else
		BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_slice: UASTC is unsupported\n");

		BASISU_NOTE_UNUSED(decode_flags);
		BASISU_NOTE_UNUSED(channel0);
		BASISU_NOTE_UNUSED(channel1);
		BASISU_NOTE_UNUSED(output_rows_in_pixels);
		BASISU_NOTE_UNUSED(output_row_pitch_in_blocks_or_pixels);
		BASISU_NOTE_UNUSED(output_block_or_pixel_stride_in_bytes);
		BASISU_NOTE_UNUSED(fmt);
		BASISU_NOTE_UNUSED(image_data_size);
		BASISU_NOTE_UNUSED(pImage_data);
		BASISU_NOTE_UNUSED(num_blocks_x);
		BASISU_NOTE_UNUSED(num_blocks_y);
		BASISU_NOTE_UNUSED(pDst_blocks);

		return false;
#endif
	}